

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsBuiltInEngineInterfaceExtensionObject.cpp
# Opt level: O0

Var Js::JsBuiltInEngineInterfaceExtensionObject::EntryJsBuiltIn_RegisterFunction
              (RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  CallFlags e;
  PropertyId propertyId;
  ScriptContext *pSVar5;
  ThreadContext *this;
  Var *values;
  undefined4 *puVar6;
  JavascriptString *pJVar7;
  JavascriptLibrary *pJVar8;
  EngineInterfaceObject *pEVar9;
  EngineExtensionObjectBase *pEVar10;
  PropertyString *pstCenter;
  ScriptFunction *pSVar11;
  DynamicObject *pDVar12;
  RecyclableObject *pRVar13;
  ScriptFunction *func;
  JavascriptString *dotPrototypeDot;
  JsBuiltInFile_conflict current;
  JavascriptString *dot;
  JavascriptString *fullName;
  PropertyString *classPropString;
  JavascriptFunction *pJStack_80;
  bool isStatic;
  DynamicObject *installTarget;
  PropertyRecord *pPStack_70;
  PropertyId methodPropID;
  PropertyRecord *methodPropertyRecord;
  JavascriptString *methodString;
  JavascriptLibrary *library;
  ScriptContext *scriptContext;
  CallInfo CStack_48;
  uint argCount;
  undefined1 local_40 [8];
  Arguments args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  pSVar5 = RecyclableObject::GetScriptContext(function);
  this = ScriptContext::GetThreadContext(pSVar5);
  pSVar5 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(this,0xc00,pSVar5,(PVOID)0x0);
  iVar4 = _count_args(callInfo);
  values = _get_va(&stack0x00000000,iVar4);
  args.Values = (Type)callInfo;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),callInfo);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JsBuiltInEngineInterfaceExtensionObject.cpp"
                                ,0x11c,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  CStack_48 = callInfo;
  Arguments::Arguments((Arguments *)local_40,callInfo,values);
  e = Js::operator&(callInfo._3_4_ &
                    (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|CallFlags_NotUsed
                     |CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|CallFlags_New),CallFlags_New
                   );
  bVar2 = operator!(e);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JsBuiltInEngineInterfaceExtensionObject.cpp"
                                ,0x11c,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  scriptContext._4_4_ = local_40._0_4_ & 0xffffff;
  library = (JavascriptLibrary *)RecyclableObject::GetScriptContext(function);
  if (scriptContext._4_4_ == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JsBuiltInEngineInterfaceExtensionObject.cpp"
                                ,0x11c,"(argCount > 0)","Should always have implicit \'this\'");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if (((local_40._0_4_ & 0xffffff) != 3) ||
     (bVar2 = VarIs<Js::ScriptFunction>(*(Var *)((long)args.Info + 0x10)), !bVar2)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JsBuiltInEngineInterfaceExtensionObject.cpp"
                                ,0x11e,
                                "(args.Info.Count == 3 && VarIs<ScriptFunction>(args.Values[2]))",
                                "args.Info.Count == 3 && VarIs<ScriptFunction>(args.Values[2])");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  methodString = (JavascriptString *)ScriptContext::GetLibrary((ScriptContext *)library);
  methodPropertyRecord =
       (PropertyRecord *)VarTo<Js::JavascriptString>(*(Var *)((long)args.Info + 8));
  pPStack_70 = (PropertyRecord *)0x0;
  (*(((JavascriptString *)methodPropertyRecord)->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x61])
            (methodPropertyRecord,&stack0xffffffffffffff90);
  propertyId = PropertyRecord::GetPropertyId(pPStack_70);
  pJStack_80 = (JavascriptFunction *)0x0;
  bVar2 = false;
  fullName = (JavascriptString *)0x0;
  pJVar7 = JavascriptLibrary::GetDotString((JavascriptLibrary *)methodString);
  pJVar8 = ScriptContext::GetLibrary((ScriptContext *)library);
  pEVar9 = JavascriptLibraryBase::GetEngineInterfaceObject(&pJVar8->super_JavascriptLibraryBase);
  pEVar10 = EngineInterfaceObject::GetEngineExtension(pEVar9,EngineInterfaceExtensionKind_JsBuiltIn)
  ;
  iVar4 = *(int *)&pEVar10[2]._vptr_EngineExtensionObjectBase;
  if (iVar4 == 0) {
    bVar2 = false;
    pJStack_80 = (JavascriptFunction *)
                 JavascriptLibraryBase::GetArrayPrototype((JavascriptLibraryBase *)methodString);
    fullName = &ScriptContext::GetPropertyString((ScriptContext *)library,0x4f)->
                super_JavascriptString;
  }
  else if (iVar4 == 1) {
    bVar2 = true;
    pJStack_80 = (JavascriptFunction *)
                 JavascriptLibraryBase::GetMathObject((JavascriptLibraryBase *)methodString);
    fullName = &ScriptContext::GetPropertyString((ScriptContext *)library,0xd7)->
                super_JavascriptString;
  }
  else if (iVar4 == 2) {
    bVar2 = true;
    pJStack_80 = JavascriptLibraryBase::GetObjectConstructor((JavascriptLibraryBase *)methodString);
    fullName = &ScriptContext::GetPropertyString((ScriptContext *)library,0x111)->
                super_JavascriptString;
  }
  if ((((methodPropertyRecord == (PropertyRecord *)0x0) || (fullName == (JavascriptString *)0x0)) ||
      (pJStack_80 == (JavascriptFunction *)0x0)) || (propertyId == 0x10)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JsBuiltInEngineInterfaceExtensionObject.cpp"
                                ,0x13c,
                                "(methodString && classPropString && installTarget && methodPropID != PropertyIds::_none)"
                                ,
                                "methodString && classPropString && installTarget && methodPropID != PropertyIds::_none"
                               );
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if (bVar2) {
    dot = JavascriptString::Concat3(fullName,pJVar7,(JavascriptString *)methodPropertyRecord);
  }
  else {
    pstCenter = ScriptContext::GetPropertyString((ScriptContext *)library,0x124);
    pJVar7 = JavascriptString::Concat3(pJVar7,&pstCenter->super_JavascriptString,pJVar7);
    dot = JavascriptString::Concat3(fullName,pJVar7,(JavascriptString *)methodPropertyRecord);
  }
  pSVar11 = UnsafeVarTo<Js::ScriptFunction>(*(Var *)((long)args.Info + 0x10));
  pSVar11 = EngineInterfaceObject::CreateLibraryCodeScriptFunction(pSVar11,dot,false,true,true);
  JavascriptLibrary::AddMember
            ((JavascriptLibrary *)methodString,&pJStack_80->super_DynamicObject,propertyId,pSVar11);
  pJVar7 = methodString;
  if (iVar4 == 0) {
    if (propertyId == 0x7a) {
      Memory::WriteBarrierPtr<Js::JavascriptFunction>::operator=
                ((WriteBarrierPtr<Js::JavascriptFunction> *)&methodString[0x25].m_charLength,
                 (JavascriptFunction *)pSVar11);
    }
    else if (propertyId == 0x89) {
      pJVar8 = ScriptContext::GetLibrary((ScriptContext *)library);
      pEVar9 = JavascriptLibraryBase::GetEngineInterfaceObject(&pJVar8->super_JavascriptLibraryBase)
      ;
      pDVar12 = EngineInterfaceObject::GetCommonNativeInterfaces(pEVar9);
      JavascriptLibrary::AddMember((JavascriptLibrary *)pJVar7,pDVar12,0x284,pSVar11);
    }
    else if (propertyId == 0x93) {
      pJVar8 = ScriptContext::GetLibrary((ScriptContext *)library);
      pEVar9 = JavascriptLibraryBase::GetEngineInterfaceObject(&pJVar8->super_JavascriptLibraryBase)
      ;
      pDVar12 = EngineInterfaceObject::GetCommonNativeInterfaces(pEVar9);
      JavascriptLibrary::AddMember((JavascriptLibrary *)pJVar7,pDVar12,0x285,pSVar11);
    }
    else if (propertyId == 0xb9) {
      pJVar8 = ScriptContext::GetLibrary((ScriptContext *)library);
      pEVar9 = JavascriptLibraryBase::GetEngineInterfaceObject(&pJVar8->super_JavascriptLibraryBase)
      ;
      pDVar12 = EngineInterfaceObject::GetCommonNativeInterfaces(pEVar9);
      JavascriptLibrary::AddMember((JavascriptLibrary *)pJVar7,pDVar12,0x286,pSVar11);
    }
    else if (propertyId == 0xcf) {
      Memory::WriteBarrierPtr<Js::JavascriptFunction>::operator=
                ((WriteBarrierPtr<Js::JavascriptFunction> *)
                 &methodString[0x25].super_RecyclableObject.type,(JavascriptFunction *)pSVar11);
    }
    else if (propertyId == 300) {
      pJVar8 = ScriptContext::GetLibrary((ScriptContext *)library);
      pEVar9 = JavascriptLibraryBase::GetEngineInterfaceObject(&pJVar8->super_JavascriptLibraryBase)
      ;
      pDVar12 = EngineInterfaceObject::GetCommonNativeInterfaces(pEVar9);
      JavascriptLibrary::AddMember((JavascriptLibrary *)pJVar7,pDVar12,0x287,pSVar11);
    }
    else if (propertyId == 399) {
      Memory::WriteBarrierPtr<Js::JavascriptFunction>::operator=
                ((WriteBarrierPtr<Js::JavascriptFunction> *)&methodString[0x9a].m_charLength,
                 (JavascriptFunction *)pSVar11);
      JavascriptLibrary::AddMember
                ((JavascriptLibrary *)methodString,&pJStack_80->super_DynamicObject,0x14,pSVar11);
    }
  }
  else if (iVar4 == 1) {
    if (propertyId == 0x2a) {
      Memory::WriteBarrierPtr<Js::JavascriptFunction>::operator=
                ((WriteBarrierPtr<Js::JavascriptFunction> *)&methodString[0x26].m_pszValue,
                 (JavascriptFunction *)pSVar11);
      pJVar7 = methodString;
      pJVar8 = ScriptContext::GetLibrary((ScriptContext *)library);
      pEVar9 = JavascriptLibraryBase::GetEngineInterfaceObject(&pJVar8->super_JavascriptLibraryBase)
      ;
      pDVar12 = EngineInterfaceObject::GetCommonNativeInterfaces(pEVar9);
      JavascriptLibrary::AddMember((JavascriptLibrary *)pJVar7,pDVar12,0x288,pSVar11);
    }
    else if (propertyId == 0xfe) {
      Memory::WriteBarrierPtr<Js::JavascriptFunction>::operator=
                ((WriteBarrierPtr<Js::JavascriptFunction> *)&methodString[0x26].m_charLength,
                 (JavascriptFunction *)pSVar11);
      pJVar7 = methodString;
      pJVar8 = ScriptContext::GetLibrary((ScriptContext *)library);
      pEVar9 = JavascriptLibraryBase::GetEngineInterfaceObject(&pJVar8->super_JavascriptLibraryBase)
      ;
      pDVar12 = EngineInterfaceObject::GetCommonNativeInterfaces(pEVar9);
      JavascriptLibrary::AddMember((JavascriptLibrary *)pJVar7,pDVar12,0x289,pSVar11);
    }
  }
  pRVar13 = JavascriptLibraryBase::GetUndefined((JavascriptLibraryBase *)methodString);
  return pRVar13;
}

Assistant:

Var JsBuiltInEngineInterfaceExtensionObject::EntryJsBuiltIn_RegisterFunction(RecyclableObject* function, CallInfo callInfo, ...)
    {
        EngineInterfaceObject_CommonFunctionProlog(function, callInfo);

        AssertOrFailFast(args.Info.Count == 3 && VarIs<ScriptFunction>(args.Values[2]));

        JavascriptLibrary * library = scriptContext->GetLibrary();

        // process function name and get property ID
        JavascriptString* methodString = VarTo<JavascriptString>(args.Values[1]);
        PropertyRecord* methodPropertyRecord = nullptr;
        methodString->GetPropertyRecord((PropertyRecord const **) &methodPropertyRecord, false);
        PropertyId methodPropID = methodPropertyRecord->GetPropertyId();

        DynamicObject *installTarget = nullptr;
        bool isStatic = false;
        PropertyString *classPropString = nullptr;
        JavascriptString *fullName = nullptr;
        JavascriptString *dot = library->GetDotString();
        JsBuiltInFile current = (static_cast<JsBuiltInEngineInterfaceExtensionObject*>(scriptContext->GetLibrary()
            ->GetEngineInterfaceObject()->GetEngineExtension(EngineInterfaceExtensionKind_JsBuiltIn)))->current;

        // determine what object this function is being added too
        switch (current)
        {
            #define file(class, type, obj) \
            case class##_##type: \
                isStatic = static_cast<bool>(IsTypeStatic::##type); \
                installTarget = library->Get##obj##(); \
                classPropString = scriptContext->GetPropertyString(PropertyIds::class); \
                break;
            JsBuiltIns(file)
        }

        Assert(methodString && classPropString && installTarget && methodPropID != PropertyIds::_none);

        if (isStatic)
        {
            fullName = JavascriptString::Concat3(classPropString, dot, methodString);
        }
        else
        {
            JavascriptString *dotPrototypeDot = JavascriptString::Concat3(dot, scriptContext->GetPropertyString(PropertyIds::prototype), dot);
            fullName = JavascriptString::Concat3(classPropString, dotPrototypeDot, methodString);
        }

        ScriptFunction *func = EngineInterfaceObject::CreateLibraryCodeScriptFunction(
            UnsafeVarTo<ScriptFunction>(args.Values[2]),
            fullName,
            false /* isConstructor */,
            true /* isJsBuiltIn */,
            true /* isPublic */
        );

        library->AddMember(installTarget, methodPropID, func);

        // Make function available to other internal facilities that need it
        // applicable for specific functions only - this may need review upon moving other functions into JsBuiltins
        if (current == JsBuiltInFile::Array_prototype)
        {
            switch (methodPropID)
            {
                case PropertyIds::entries:
                    library->arrayPrototypeEntriesFunction = func;
                    break;
                case PropertyIds::values:
                    library->arrayPrototypeValuesFunction = func;
                    library->AddMember(installTarget, PropertyIds::_symbolIterator, func);
                    break;
                case PropertyIds::keys:
                    library->arrayPrototypeKeysFunction = func;
                    break;
                case PropertyIds::forEach:
                    library->AddMember(scriptContext->GetLibrary()->GetEngineInterfaceObject()->GetCommonNativeInterfaces(), PropertyIds::builtInArray_prototype_forEach, func);
                    break;
                case PropertyIds::filter:
                    library->AddMember(scriptContext->GetLibrary()->GetEngineInterfaceObject()->GetCommonNativeInterfaces(), PropertyIds::builtInArray_prototype_filter, func);
                    break;
                case PropertyIds::indexOf:
                    library->AddMember(scriptContext->GetLibrary()->GetEngineInterfaceObject()->GetCommonNativeInterfaces(), PropertyIds::builtInArray_prototype_indexOf, func);
                    break;
                case PropertyIds::reduce:
                    library->AddMember(scriptContext->GetLibrary()->GetEngineInterfaceObject()->GetCommonNativeInterfaces(), PropertyIds::builtInArray_prototype_reduce, func);
                    break;
            }
        }
        else if (current == JsBuiltInFile::Math_object)
        {
            switch (methodPropID)
            {
                case PropertyIds::max:
                    library->mathMax = func;
                    library->AddMember(scriptContext->GetLibrary()->GetEngineInterfaceObject()->GetCommonNativeInterfaces(), PropertyIds::builtInMath_object_max, func);
                    break;
                case PropertyIds::min:
                    library->mathMin = func;
                    library->AddMember(scriptContext->GetLibrary()->GetEngineInterfaceObject()->GetCommonNativeInterfaces(), PropertyIds::builtInMath_object_min, func);
                    break;
            }
        }
        //Don't need to return anything
        return library->GetUndefined();
    }